

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

void renameColumnElistNames(Parse *pParse,RenameCtx *pCtx,ExprList *pEList,char *zOld)

{
  char *zLeft;
  int iVar1;
  char **ppcVar2;
  long lVar3;
  
  if (pEList != (ExprList *)0x0) {
    ppcVar2 = &pEList->a[0].zEName;
    for (lVar3 = 0; lVar3 < pEList->nExpr; lVar3 = lVar3 + 1) {
      zLeft = *ppcVar2;
      if (zLeft != (char *)0x0 && (*(byte *)((long)ppcVar2 + 9) & 3) == 0) {
        iVar1 = sqlite3_stricmp(zLeft,zOld);
        if (iVar1 == 0) {
          renameTokenFind(pParse,pCtx,zLeft);
        }
      }
      ppcVar2 = ppcVar2 + 3;
    }
  }
  return;
}

Assistant:

static void renameColumnElistNames(
  Parse *pParse,
  RenameCtx *pCtx,
  const ExprList *pEList,
  const char *zOld
){
  if( pEList ){
    int i;
    for(i=0; i<pEList->nExpr; i++){
      const char *zName = pEList->a[i].zEName;
      if( ALWAYS(pEList->a[i].fg.eEName==ENAME_NAME)
       && ALWAYS(zName!=0)
       && 0==sqlite3_stricmp(zName, zOld)
      ){
        renameTokenFind(pParse, pCtx, (const void*)zName);
      }
    }
  }
}